

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O1

void __thiscall wasm::CodeFolding::visitSwitch(CodeFolding *this,Switch *curr)

{
  size_t *psVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  undefined1 auStack_48 [8];
  Name target;
  
  sVar2 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
  target.super_IString.str._M_str = (char *)this;
  if (sVar2 != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements <=
          uVar3) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                     );
      }
      psVar1 = (size_t *)
               ((long)&(((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                        data)->super_IString).str._M_len + lVar4);
      auStack_48 = (undefined1  [8])*psVar1;
      target.super_IString.str._M_len = psVar1[1];
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&this->unoptimizables,(Name *)auStack_48);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (sVar2 != uVar3);
  }
  std::
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  ::_M_insert_unique<wasm::Name_const&>
            ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
              *)(target.super_IString.str._M_str + 0x1e0),&curr->default_);
  return;
}

Assistant:

void visitSwitch(Switch* curr) {
    for (auto target : curr->targets) {
      unoptimizables.insert(target);
    }
    unoptimizables.insert(curr->default_);
  }